

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mempool.cpp
# Opt level: O0

RPCHelpMan * sendrawtransaction(void)

{
  initializer_list<RPCArg> __l;
  RPCHelpMan *in_RDI;
  undefined1 *puVar1;
  long in_FS_OFFSET;
  allocator<RPCArg> *in_stack_fffffffffffff398;
  RPCArg *this;
  UniValue *in_stack_fffffffffffff3a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff3a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff3b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff3c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff3d0;
  UniValue *in_stack_fffffffffffff3d8;
  undefined1 *puVar2;
  iterator in_stack_fffffffffffff3e0;
  RPCArgOptions *in_stack_fffffffffffff3e8;
  string *in_stack_fffffffffffff3f0;
  Fallback *in_stack_fffffffffffff3f8;
  undefined1 skip_type_check;
  vector<RPCResult,_std::allocator<RPCResult>_> *in_stack_fffffffffffff400;
  string *in_stack_fffffffffffff408;
  RPCArg *in_stack_fffffffffffff410;
  RPCResults *in_stack_fffffffffffff418;
  RPCResult *in_stack_fffffffffffff420;
  _Alloc_hider in_stack_fffffffffffff4e0;
  RPCResults *in_stack_fffffffffffff4e8;
  undefined8 in_stack_fffffffffffff4f0;
  undefined8 in_stack_fffffffffffff4f8;
  string *in_stack_fffffffffffff500;
  pointer this_00;
  allocator<char> local_ada;
  allocator<char> local_ad9 [30];
  allocator<char> local_abb;
  allocator<char> local_aba;
  allocator<char> local_ab9 [8];
  allocator<char> local_ab1 [31];
  allocator<char> local_a92;
  allocator<char> local_a91 [145];
  RPCMethodImpl *in_stack_fffffffffffff600;
  undefined1 local_360 [792];
  undefined1 local_48 [64];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff3e8,(char *)in_stack_fffffffffffff3e0,
             (allocator<char> *)in_stack_fffffffffffff3d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff3e8,(char *)in_stack_fffffffffffff3e0,
             (allocator<char> *)in_stack_fffffffffffff3d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff3e8,(char *)in_stack_fffffffffffff3e0,
             (allocator<char> *)in_stack_fffffffffffff3d8);
  local_ab9[1] = (allocator<char>)0x0;
  local_ab9[2] = (allocator<char>)0x0;
  local_ab9[3] = (allocator<char>)0x0;
  local_ab9[4] = (allocator<char>)0x0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_fffffffffffff3a8,&in_stack_fffffffffffff3a0->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff3e8,(char *)in_stack_fffffffffffff3e0,
             (allocator<char> *)in_stack_fffffffffffff3d8);
  std::__cxx11::string::string(in_stack_fffffffffffff3b0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff398);
  RPCArg::RPCArg(in_stack_fffffffffffff410,in_stack_fffffffffffff408,
                 (Type)((ulong)in_stack_fffffffffffff400 >> 0x20),in_stack_fffffffffffff3f8,
                 in_stack_fffffffffffff3f0,in_stack_fffffffffffff3e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff3e8,(char *)in_stack_fffffffffffff3e0,
             (allocator<char> *)in_stack_fffffffffffff3d8);
  CFeeRate::GetFeePerK((CFeeRate *)in_stack_fffffffffffff398);
  FormatMoney_abi_cxx11_((CAmount)in_stack_fffffffffffff3f0);
  UniValue::
  UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (in_stack_fffffffffffff3d8,in_stack_fffffffffffff3d0);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_fffffffffffff3a8,in_stack_fffffffffffff3a0);
  std::operator+(&in_stack_fffffffffffff3e8->skip_type_check,&in_stack_fffffffffffff3e0->m_names);
  std::operator+(in_stack_fffffffffffff3b0,(char *)in_stack_fffffffffffff3a8);
  std::__cxx11::string::string(in_stack_fffffffffffff3b0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff398);
  RPCArg::RPCArg(in_stack_fffffffffffff410,in_stack_fffffffffffff408,
                 (Type)((ulong)in_stack_fffffffffffff400 >> 0x20),in_stack_fffffffffffff3f8,
                 in_stack_fffffffffffff3f0,in_stack_fffffffffffff3e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff3e8,(char *)in_stack_fffffffffffff3e0,
             (allocator<char> *)in_stack_fffffffffffff3d8);
  FormatMoney_abi_cxx11_((CAmount)in_stack_fffffffffffff3f0);
  UniValue::
  UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (in_stack_fffffffffffff3d8,in_stack_fffffffffffff3d0);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_fffffffffffff3a8,in_stack_fffffffffffff3a0);
  std::operator+(&in_stack_fffffffffffff3e8->skip_type_check,&in_stack_fffffffffffff3e0->m_names);
  std::operator+(in_stack_fffffffffffff3b0,(char *)in_stack_fffffffffffff3a8);
  std::__cxx11::string::string(in_stack_fffffffffffff3b0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff398);
  RPCArg::RPCArg(in_stack_fffffffffffff410,in_stack_fffffffffffff408,
                 (Type)((ulong)in_stack_fffffffffffff400 >> 0x20),in_stack_fffffffffffff3f8,
                 in_stack_fffffffffffff3f0,in_stack_fffffffffffff3e8);
  skip_type_check = (undefined1)((ulong)in_stack_fffffffffffff3f8 >> 0x38);
  std::allocator<RPCArg>::allocator(in_stack_fffffffffffff398);
  __l._M_len = (size_type)in_stack_fffffffffffff3e8;
  __l._M_array = in_stack_fffffffffffff3e0;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff3d8,__l,
             (allocator_type *)in_stack_fffffffffffff3d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff3e8,(char *)in_stack_fffffffffffff3e0,
             (allocator<char> *)in_stack_fffffffffffff3d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff3e8,(char *)in_stack_fffffffffffff3e0,
             (allocator<char> *)in_stack_fffffffffffff3d8);
  this_00 = (pointer)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff398);
  RPCResult::RPCResult
            (in_stack_fffffffffffff420,(Type)((ulong)in_stack_fffffffffffff418 >> 0x20),
             &in_stack_fffffffffffff410->m_names,in_stack_fffffffffffff408,in_stack_fffffffffffff400
             ,(bool)skip_type_check);
  RPCResults::RPCResults(in_stack_fffffffffffff418,(RPCResult *)in_stack_fffffffffffff410);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff3e8,(char *)in_stack_fffffffffffff3e0,
             (allocator<char> *)in_stack_fffffffffffff3d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff3e8,(char *)in_stack_fffffffffffff3e0,
             (allocator<char> *)in_stack_fffffffffffff3d8);
  HelpExampleCli(in_stack_fffffffffffff3d0,in_stack_fffffffffffff3c8);
  std::operator+((char *)in_stack_fffffffffffff3b0,in_stack_fffffffffffff3a8);
  std::operator+(in_stack_fffffffffffff3b0,(char *)in_stack_fffffffffffff3a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff3e8,(char *)in_stack_fffffffffffff3e0,
             (allocator<char> *)in_stack_fffffffffffff3d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff3e8,(char *)in_stack_fffffffffffff3e0,
             (allocator<char> *)in_stack_fffffffffffff3d8);
  HelpExampleCli(in_stack_fffffffffffff3d0,in_stack_fffffffffffff3c8);
  std::operator+(in_stack_fffffffffffff3d0,in_stack_fffffffffffff3c8);
  std::operator+(in_stack_fffffffffffff3b0,(char *)in_stack_fffffffffffff3a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff3e8,(char *)in_stack_fffffffffffff3e0,
             (allocator<char> *)in_stack_fffffffffffff3d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff3e8,(char *)in_stack_fffffffffffff3e0,
             (allocator<char> *)in_stack_fffffffffffff3d8);
  HelpExampleCli(in_stack_fffffffffffff3d0,in_stack_fffffffffffff3c8);
  std::operator+(in_stack_fffffffffffff3d0,in_stack_fffffffffffff3c8);
  std::operator+(in_stack_fffffffffffff3b0,(char *)in_stack_fffffffffffff3a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff3e8,(char *)in_stack_fffffffffffff3e0,
             (allocator<char> *)in_stack_fffffffffffff3d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff3e8,(char *)in_stack_fffffffffffff3e0,
             (allocator<char> *)in_stack_fffffffffffff3d8);
  HelpExampleRpc(in_stack_fffffffffffff3d0,in_stack_fffffffffffff3c8);
  std::operator+(in_stack_fffffffffffff3d0,in_stack_fffffffffffff3c8);
  RPCExamples::RPCExamples((RPCExamples *)in_stack_fffffffffffff398,(string *)0x5dfa8f);
  this = (RPCArg *)&stack0xfffffffffffff4e0;
  std::function<UniValue(RPCHelpMan_const&,JSONRPCRequest_const&)>::
  function<sendrawtransaction()::__0,void>
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)
             in_stack_fffffffffffff3a8,(anon_class_1_0_00000001 *)in_stack_fffffffffffff3a0);
  RPCHelpMan::RPCHelpMan
            ((RPCHelpMan *)this_00,in_stack_fffffffffffff500,(string *)in_stack_fffffffffffff4f8,
             (vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff4f0,
             in_stack_fffffffffffff4e8,(RPCExamples *)in_stack_fffffffffffff4e0._M_p,
             in_stack_fffffffffffff600);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)this);
  RPCExamples::~RPCExamples((RPCExamples *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff500);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff501);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff502);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff503);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff504);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff505);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff506);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff507);
  RPCResults::~RPCResults((RPCResults *)this);
  RPCResult::~RPCResult((RPCResult *)this);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff3a8);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_ada);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_ad9);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff3a8);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this);
  puVar2 = local_360;
  puVar1 = local_48;
  do {
    puVar1 = puVar1 + -0x108;
    RPCArg::~RPCArg(this);
  } while (puVar1 != puVar2);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  UniValue::~UniValue((UniValue *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_abb);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  UniValue::~UniValue((UniValue *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_aba);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_ab9);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_ab1);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_a92);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_a91);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan sendrawtransaction()
{
    return RPCHelpMan{"sendrawtransaction",
        "\nSubmit a raw transaction (serialized, hex-encoded) to local node and network.\n"
        "\nThe transaction will be sent unconditionally to all peers, so using sendrawtransaction\n"
        "for manual rebroadcast may degrade privacy by leaking the transaction's origin, as\n"
        "nodes will normally not rebroadcast non-wallet transactions already in their mempool.\n"
        "\nA specific exception, RPC_TRANSACTION_ALREADY_IN_UTXO_SET, may throw if the transaction cannot be added to the mempool.\n"
        "\nRelated RPCs: createrawtransaction, signrawtransactionwithkey\n",
        {
            {"hexstring", RPCArg::Type::STR_HEX, RPCArg::Optional::NO, "The hex string of the raw transaction"},
            {"maxfeerate", RPCArg::Type::AMOUNT, RPCArg::Default{FormatMoney(DEFAULT_MAX_RAW_TX_FEE_RATE.GetFeePerK())},
             "Reject transactions whose fee rate is higher than the specified value, expressed in " + CURRENCY_UNIT +
                 "/kvB.\nFee rates larger than 1BTC/kvB are rejected.\nSet to 0 to accept any fee rate."},
            {"maxburnamount", RPCArg::Type::AMOUNT, RPCArg::Default{FormatMoney(DEFAULT_MAX_BURN_AMOUNT)},
             "Reject transactions with provably unspendable outputs (e.g. 'datacarrier' outputs that use the OP_RETURN opcode) greater than the specified value, expressed in " + CURRENCY_UNIT + ".\n"
             "If burning funds through unspendable outputs is desired, increase this value.\n"
             "This check is based on heuristics and does not guarantee spendability of outputs.\n"},
        },
        RPCResult{
            RPCResult::Type::STR_HEX, "", "The transaction hash in hex"
        },
        RPCExamples{
            "\nCreate a transaction\n"
            + HelpExampleCli("createrawtransaction", "\"[{\\\"txid\\\" : \\\"mytxid\\\",\\\"vout\\\":0}]\" \"{\\\"myaddress\\\":0.01}\"") +
            "Sign the transaction, and get back the hex\n"
            + HelpExampleCli("signrawtransactionwithwallet", "\"myhex\"") +
            "\nSend the transaction (signed hex)\n"
            + HelpExampleCli("sendrawtransaction", "\"signedhex\"") +
            "\nAs a JSON-RPC call\n"
            + HelpExampleRpc("sendrawtransaction", "\"signedhex\"")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
        {
            const CAmount max_burn_amount = request.params[2].isNull() ? 0 : AmountFromValue(request.params[2]);

            CMutableTransaction mtx;
            if (!DecodeHexTx(mtx, request.params[0].get_str())) {
                throw JSONRPCError(RPC_DESERIALIZATION_ERROR, "TX decode failed. Make sure the tx has at least one input.");
            }

            for (const auto& out : mtx.vout) {
                if((out.scriptPubKey.IsUnspendable() || !out.scriptPubKey.HasValidOps()) && out.nValue > max_burn_amount) {
                    throw JSONRPCTransactionError(TransactionError::MAX_BURN_EXCEEDED);
                }
            }

            CTransactionRef tx(MakeTransactionRef(std::move(mtx)));

            const CFeeRate max_raw_tx_fee_rate{ParseFeeRate(self.Arg<UniValue>("maxfeerate"))};

            int64_t virtual_size = GetVirtualTransactionSize(*tx);
            CAmount max_raw_tx_fee = max_raw_tx_fee_rate.GetFee(virtual_size);

            std::string err_string;
            AssertLockNotHeld(cs_main);
            NodeContext& node = EnsureAnyNodeContext(request.context);
            const TransactionError err = BroadcastTransaction(node, tx, err_string, max_raw_tx_fee, /*relay=*/true, /*wait_callback=*/true);
            if (TransactionError::OK != err) {
                throw JSONRPCTransactionError(err, err_string);
            }

            return tx->GetHash().GetHex();
        },
    };
}